

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
          *cols,size_t row)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  pointer pSVar5;
  string value;
  char local_5a [2];
  char *local_58;
  long local_50;
  char local_48 [16];
  string *local_38;
  
  pSVar5 = (cols->
           super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = label;
  if (pSVar5 != (cols->
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pbVar1 = (pSVar5->rows).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_58 = local_48;
      pcVar2 = pbVar1[row]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + pbVar1[row]._M_string_length);
      if ((pSVar5->label)._M_string_length == 0) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((this->super_StreamingReporterBase).stream,(local_38->_M_dataplus)._M_p,
                            local_38->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        iVar3 = std::__cxx11::string::compare((char *)&local_58);
        poVar4 = (this->super_StreamingReporterBase).stream;
        if (iVar3 == 0) {
          local_5a[0] = '\0';
          Colour::use(ReconstructedExpression);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"- none -",8);
          Colour::use(None);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_58,local_50);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_58);
        if (iVar3 != 0) {
          poVar4 = (this->super_StreamingReporterBase).stream;
          local_5a[0] = '\0';
          Colour::use(FileName);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," | ",3);
          Colour::use(None);
          poVar4 = (this->super_StreamingReporterBase).stream;
          local_5a[1] = 0;
          Colour::use(pSVar5->colour);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_58,local_50);
          local_5a[0] = ' ';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5a,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(pSVar5->label)._M_dataplus._M_p,(pSVar5->label)._M_string_length);
          Colour::use(None);
        }
      }
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != (cols->
                       super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_58 = (char *)CONCAT71(local_58._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).stream,(char *)&local_58,1);
  return;
}

Assistant:

void printSummaryRow( std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row ) {
            for( std::vector<SummaryColumn>::const_iterator it = cols.begin(); it != cols.end(); ++it ) {
                std::string value = it->rows[row];
                if( it->label.empty() ) {
                    stream << label << ": ";
                    if( value != "0" )
                        stream << value;
                    else
                        stream << Colour( Colour::Warning ) << "- none -";
                }
                else if( value != "0" ) {
                    stream  << Colour( Colour::LightGrey ) << " | ";
                    stream  << Colour( it->colour )
                            << value << ' ' << it->label;
                }
            }
            stream << '\n';
        }